

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *
testing::internal::
MatcherCastImpl<const_std::pair<phmap::priv::NonStandardLayout,_int>_&,_std::pair<const_phmap::priv::NonStandardLayout,_int>_>
::CastImpl(Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *__return_storage_ptr__,
          pair<const_phmap::priv::NonStandardLayout,_int> *value)

{
  pair<phmap::priv::NonStandardLayout,_int> *value_00;
  pair<phmap::priv::NonStandardLayout,_int> local_50;
  pair<const_phmap::priv::NonStandardLayout,_int> *local_20;
  pair<const_phmap::priv::NonStandardLayout,_int> *value_local;
  Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&> *local_10;
  
  local_20 = value;
  local_10 = __return_storage_ptr__;
  std::pair<phmap::priv::NonStandardLayout,_int>::
  pair<const_phmap::priv::NonStandardLayout,_int,_true>(&local_50,value);
  value_00 = ImplicitCast_<std::pair<phmap::priv::NonStandardLayout,int>const&>(&local_50);
  Matcher<const_std::pair<phmap::priv::NonStandardLayout,_int>_&>::Matcher
            (__return_storage_ptr__,value_00);
  std::pair<phmap::priv::NonStandardLayout,_int>::~pair(&local_50);
  return __return_storage_ptr__;
}

Assistant:

static Matcher<T> CastImpl(const M& value,
                             std::false_type /* convertible_to_matcher */,
                             std::true_type /* convertible_to_T */) {
    return Matcher<T>(ImplicitCast_<T>(value));
  }